

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

int input_bin(char *fname,int *length)

{
  int iVar1;
  FILE *__stream;
  int local_2c;
  int c;
  int cc;
  FILE *fp;
  int *length_local;
  char *fname_local;
  
  local_2c = 0;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    fname_local._4_4_ = 0;
  }
  else {
    while (iVar1 = fgetc(__stream), iVar1 != -1 && local_2c < 0x8000) {
      ebuf[local_2c] = (uint8)iVar1;
      local_2c = local_2c + 1;
    }
    *length = local_2c;
    fclose(__stream);
    fname_local._4_4_ = 1;
  }
  return fname_local._4_4_;
}

Assistant:

int input_bin(char *fname, int *length)
{
   FILE *fp;
 
   int cc = 0, c;

   fp = fopen(fname, "rb");
   if(fp == NULL) 
      return 0;
   while (((c = fgetc(fp)) != EOF) && (cc < MAXBUF))
      ebuf[cc++] = (uint8)c;
   *length = cc;
   fclose(fp);
   
   return 1;
}